

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O1

Interval * __thiscall
deqp::gls::BuiltinPrecisionTests::FloatFunc1::applyPoint
          (Interval *__return_storage_ptr__,FloatFunc1 *this,EvalContext *ctx,double arg0)

{
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  Interval local_48;
  Interval local_30;
  
  (*(this->
    super_PrimitiveFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
    ).
    super_Func<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
    .super_FuncBase._vptr_FuncBase[0xd])(this);
  (*(this->
    super_PrimitiveFunc<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
    ).
    super_Func<deqp::gls::BuiltinPrecisionTests::Signature<float,_float,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void,_deqp::gls::BuiltinPrecisionTests::Void>_>
    .super_FuncBase._vptr_FuncBase[0xf])(this,ctx);
  local_48.m_hasNaN = NAN(extraout_XMM0_Qa);
  dVar1 = INFINITY;
  local_48.m_lo = INFINITY;
  if (!local_48.m_hasNaN) {
    local_48.m_lo = extraout_XMM0_Qa;
  }
  local_48.m_hi = -INFINITY;
  if (!local_48.m_hasNaN) {
    local_48.m_hi = extraout_XMM0_Qa;
  }
  local_30.m_hasNaN = NAN(extraout_XMM0_Qa_00);
  dVar4 = INFINITY;
  dVar3 = -INFINITY;
  dVar2 = -INFINITY;
  if (!local_30.m_hasNaN) {
    dVar1 = -extraout_XMM0_Qa_00;
    dVar2 = dVar1;
    dVar3 = extraout_XMM0_Qa_00;
    dVar4 = extraout_XMM0_Qa_00;
  }
  local_30.m_lo =
       (double)(~-(ulong)(dVar1 <= dVar4) & (ulong)dVar4 | (ulong)dVar1 & -(ulong)(dVar1 <= dVar4));
  local_30.m_hi =
       (double)(~-(ulong)(dVar3 <= dVar2) & (ulong)dVar3 | (ulong)dVar2 & -(ulong)(dVar3 <= dVar2));
  tcu::operator+(__return_storage_ptr__,&local_48,&local_30);
  return __return_storage_ptr__;
}

Assistant:

virtual Interval	applyPoint		(const EvalContext& ctx, double arg0) const
	{
		const double	exact	= this->applyExact(arg0);
		const double	prec	= this->precision(ctx, exact, arg0);

		return exact + Interval(-prec, prec);
	}